

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz_util.cc
# Opt level: O2

size_t __thiscall upb::fuzz::anon_unknown_0::Builder::NextLink(Builder *this)

{
  pointer puVar1;
  pointer puVar2;
  size_t sVar3;
  
  puVar1 = (this->input_->links).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->input_->links).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar1 != puVar2) {
    sVar3 = 0;
    if (this->link_ != (long)puVar2 - (long)puVar1 >> 2) {
      sVar3 = this->link_;
    }
    this->link_ = sVar3 + 1;
    return (ulong)puVar1[sVar3];
  }
  return 0;
}

Assistant:

size_t NextLink() {
    if (input_->links.empty()) return 0;
    if (link_ == input_->links.size()) link_ = 0;
    return input_->links[link_++];
  }